

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O0

void ImGui::StyleColorsMahiDark2(void)

{
  float fVar1;
  ImGuiStyle *pIVar2;
  ImVec4 local_320;
  ImVec4 local_310;
  ImVec4 local_300;
  ImVec4 local_2f0;
  ImVec4 local_2e0;
  ImVec4 local_2d0;
  ImVec4 local_2c0;
  ImVec4 local_2b0;
  ImVec4 local_2a0;
  ImVec4 local_290;
  ImVec4 local_280;
  ImVec4 local_270;
  ImVec4 local_260;
  ImVec4 local_250;
  ImVec4 local_240;
  ImVec4 local_230;
  ImVec4 local_220;
  ImVec4 local_210;
  ImVec4 local_200;
  ImVec4 local_1f0;
  ImVec4 local_1e0;
  ImVec4 local_1d0;
  ImVec4 local_1c0;
  ImVec4 local_1b0;
  ImVec4 local_1a0;
  ImVec4 local_190;
  ImVec4 local_180;
  ImVec4 local_170;
  ImVec4 local_160;
  ImVec4 local_150;
  ImVec4 local_140;
  ImVec4 local_130;
  ImVec4 local_120;
  ImVec4 local_110;
  ImVec4 local_100;
  ImVec4 local_f0;
  ImVec4 local_e0;
  ImVec4 local_d0;
  ImVec4 local_c0;
  ImVec4 local_b0;
  ImVec4 local_a0;
  ImVec4 local_90;
  ImVec4 local_80;
  ImVec4 local_70;
  ImVec4 local_60;
  ImVec4 local_50;
  ImVec4 local_40;
  ImVec4 local_30;
  ImVec4 local_20;
  ImVec4 *local_10;
  ImVec4 *colors;
  
  pIVar2 = GetStyle();
  local_10 = pIVar2->Colors;
  ImVec4::ImVec4(&local_20,1.0,1.0,1.0,1.0);
  local_10->x = local_20.x;
  local_10->y = local_20.y;
  local_10->z = local_20.z;
  local_10->w = local_20.w;
  ImVec4::ImVec4(&local_30,0.5,0.5,0.5,1.0);
  local_10[1].x = local_30.x;
  local_10[1].y = local_30.y;
  local_10[1].z = local_30.z;
  local_10[1].w = local_30.w;
  ImVec4::ImVec4(&local_40,0.18,0.18,0.18,1.0);
  local_10[2].x = local_40.x;
  local_10[2].y = local_40.y;
  local_10[2].z = local_40.z;
  local_10[2].w = local_40.w;
  ImVec4::ImVec4(&local_50,0.28,0.28,0.28,0.0);
  local_10[3].x = local_50.x;
  local_10[3].y = local_50.y;
  local_10[3].z = local_50.z;
  local_10[3].w = local_50.w;
  ImVec4::ImVec4(&local_60,0.313,0.313,0.313,1.0);
  local_10[4].x = local_60.x;
  local_10[4].y = local_60.y;
  local_10[4].z = local_60.z;
  local_10[4].w = local_60.w;
  ImVec4::ImVec4(&local_70,0.266,0.266,0.266,1.0);
  local_10[5].x = local_70.x;
  local_10[5].y = local_70.y;
  local_10[5].z = local_70.z;
  local_10[5].w = local_70.w;
  ImVec4::ImVec4(&local_80,0.0,0.0,0.0,0.0);
  local_10[6].x = local_80.x;
  local_10[6].y = local_80.y;
  local_10[6].z = local_80.z;
  local_10[6].w = local_80.w;
  ImVec4::ImVec4(&local_90,0.16,0.16,0.16,1.0);
  local_10[7].x = local_90.x;
  local_10[7].y = local_90.y;
  local_10[7].z = local_90.z;
  local_10[7].w = local_90.w;
  ImVec4::ImVec4(&local_a0,0.2,0.2,0.2,1.0);
  local_10[8].x = local_a0.x;
  local_10[8].y = local_a0.y;
  local_10[8].z = local_a0.z;
  local_10[8].w = local_a0.w;
  ImVec4::ImVec4(&local_b0,0.28,0.28,0.28,1.0);
  local_10[9].x = local_b0.x;
  local_10[9].y = local_b0.y;
  local_10[9].z = local_b0.z;
  local_10[9].w = local_b0.w;
  ImVec4::ImVec4(&local_c0,0.148,0.148,0.148,1.0);
  local_10[10].x = local_c0.x;
  local_10[10].y = local_c0.y;
  local_10[10].z = local_c0.z;
  local_10[10].w = local_c0.w;
  ImVec4::ImVec4(&local_d0,0.148,0.148,0.148,1.0);
  local_10[0xb].x = local_d0.x;
  local_10[0xb].y = local_d0.y;
  local_10[0xb].z = local_d0.z;
  local_10[0xb].w = local_d0.w;
  ImVec4::ImVec4(&local_e0,0.148,0.148,0.148,1.0);
  local_10[0xc].x = local_e0.x;
  local_10[0xc].y = local_e0.y;
  local_10[0xc].z = local_e0.z;
  local_10[0xc].w = local_e0.w;
  ImVec4::ImVec4(&local_f0,0.195,0.195,0.195,1.0);
  local_10[0xd].x = local_f0.x;
  local_10[0xd].y = local_f0.y;
  local_10[0xd].z = local_f0.z;
  local_10[0xd].w = local_f0.w;
  ImVec4::ImVec4(&local_100,0.16,0.16,0.16,1.0);
  local_10[0xe].x = local_100.x;
  local_10[0xe].y = local_100.y;
  local_10[0xe].z = local_100.z;
  local_10[0xe].w = local_100.w;
  ImVec4::ImVec4(&local_110,0.277,0.277,0.277,1.0);
  local_10[0xf].x = local_110.x;
  local_10[0xf].y = local_110.y;
  local_10[0xf].z = local_110.z;
  local_10[0xf].w = local_110.w;
  ImVec4::ImVec4(&local_120,0.3,0.3,0.3,1.0);
  local_10[0x10].x = local_120.x;
  local_10[0x10].y = local_120.y;
  local_10[0x10].z = local_120.z;
  local_10[0x10].w = local_120.w;
  ImVec4::ImVec4(&local_130,1.0,0.391,0.0,1.0);
  local_10[0x11].x = local_130.x;
  local_10[0x11].y = local_130.y;
  local_10[0x11].z = local_130.z;
  local_10[0x11].w = local_130.w;
  ImVec4::ImVec4(&local_140,1.0,1.0,1.0,1.0);
  local_10[0x12].x = local_140.x;
  local_10[0x12].y = local_140.y;
  local_10[0x12].z = local_140.z;
  local_10[0x12].w = local_140.w;
  ImVec4::ImVec4(&local_150,0.391,0.391,0.391,1.0);
  local_10[0x13].x = local_150.x;
  local_10[0x13].y = local_150.y;
  local_10[0x13].z = local_150.z;
  local_10[0x13].w = local_150.w;
  ImVec4::ImVec4(&local_160,1.0,0.391,0.0,1.0);
  local_10[0x14].x = local_160.x;
  local_10[0x14].y = local_160.y;
  local_10[0x14].z = local_160.z;
  local_10[0x14].w = local_160.w;
  ImVec4::ImVec4(&local_170,1.0,1.0,1.0,0.0);
  local_10[0x15].x = local_170.x;
  local_10[0x15].y = local_170.y;
  local_10[0x15].z = local_170.z;
  local_10[0x15].w = local_170.w;
  ImVec4::ImVec4(&local_180,1.0,1.0,1.0,0.156);
  local_10[0x16].x = local_180.x;
  local_10[0x16].y = local_180.y;
  local_10[0x16].z = local_180.z;
  local_10[0x16].w = local_180.w;
  ImVec4::ImVec4(&local_190,1.0,1.0,1.0,0.391);
  local_10[0x17].x = local_190.x;
  local_10[0x17].y = local_190.y;
  local_10[0x17].z = local_190.z;
  local_10[0x17].w = local_190.w;
  ImVec4::ImVec4(&local_1a0,0.313,0.313,0.313,1.0);
  local_10[0x18].x = local_1a0.x;
  local_10[0x18].y = local_1a0.y;
  local_10[0x18].z = local_1a0.z;
  local_10[0x18].w = local_1a0.w;
  ImVec4::ImVec4(&local_1b0,0.469,0.469,0.469,1.0);
  local_10[0x19].x = local_1b0.x;
  local_10[0x19].y = local_1b0.y;
  local_10[0x19].z = local_1b0.z;
  local_10[0x19].w = local_1b0.w;
  ImVec4::ImVec4(&local_1c0,0.469,0.469,0.469,1.0);
  local_10[0x1a].x = local_1c0.x;
  local_10[0x1a].y = local_1c0.y;
  local_10[0x1a].z = local_1c0.z;
  local_10[0x1a].w = local_1c0.w;
  fVar1 = local_10[5].y;
  local_10[0x1b].x = local_10[5].x;
  local_10[0x1b].y = fVar1;
  fVar1 = local_10[5].w;
  local_10[0x1b].z = local_10[5].z;
  local_10[0x1b].w = fVar1;
  ImVec4::ImVec4(&local_1d0,0.391,0.391,0.391,1.0);
  local_10[0x1c].x = local_1d0.x;
  local_10[0x1c].y = local_1d0.y;
  local_10[0x1c].z = local_1d0.z;
  local_10[0x1c].w = local_1d0.w;
  ImVec4::ImVec4(&local_1e0,1.0,0.391,0.0,1.0);
  local_10[0x1d].x = local_1e0.x;
  local_10[0x1d].y = local_1e0.y;
  local_10[0x1d].z = local_1e0.z;
  local_10[0x1d].w = local_1e0.w;
  ImVec4::ImVec4(&local_1f0,1.0,1.0,1.0,0.25);
  local_10[0x1e].x = local_1f0.x;
  local_10[0x1e].y = local_1f0.y;
  local_10[0x1e].z = local_1f0.z;
  local_10[0x1e].w = local_1f0.w;
  ImVec4::ImVec4(&local_200,1.0,1.0,1.0,0.67);
  local_10[0x1f].x = local_200.x;
  local_10[0x1f].y = local_200.y;
  local_10[0x1f].z = local_200.z;
  local_10[0x1f].w = local_200.w;
  ImVec4::ImVec4(&local_210,1.0,0.391,0.0,1.0);
  local_10[0x20].x = local_210.x;
  local_10[0x20].y = local_210.y;
  local_10[0x20].z = local_210.z;
  local_10[0x20].w = local_210.w;
  ImVec4::ImVec4(&local_220,0.098,0.098,0.098,1.0);
  local_10[0x21].x = local_220.x;
  local_10[0x21].y = local_220.y;
  local_10[0x21].z = local_220.z;
  local_10[0x21].w = local_220.w;
  ImVec4::ImVec4(&local_230,0.352,0.352,0.352,1.0);
  local_10[0x22].x = local_230.x;
  local_10[0x22].y = local_230.y;
  local_10[0x22].z = local_230.z;
  local_10[0x22].w = local_230.w;
  ImVec4::ImVec4(&local_240,0.195,0.195,0.195,1.0);
  local_10[0x23].x = local_240.x;
  local_10[0x23].y = local_240.y;
  local_10[0x23].z = local_240.z;
  local_10[0x23].w = local_240.w;
  ImVec4::ImVec4(&local_250,0.098,0.098,0.098,1.0);
  local_10[0x24].x = local_250.x;
  local_10[0x24].y = local_250.y;
  local_10[0x24].z = local_250.z;
  local_10[0x24].w = local_250.w;
  ImVec4::ImVec4(&local_260,0.195,0.195,0.195,1.0);
  local_10[0x25].x = local_260.x;
  local_10[0x25].y = local_260.y;
  local_10[0x25].z = local_260.z;
  local_10[0x25].w = local_260.w;
  ImVec4::ImVec4(&local_270,1.0,0.391,0.0,0.781);
  local_10[0x26].x = local_270.x;
  local_10[0x26].y = local_270.y;
  local_10[0x26].z = local_270.z;
  local_10[0x26].w = local_270.w;
  ImVec4::ImVec4(&local_280,0.18,0.18,0.18,1.0);
  local_10[0x27].x = local_280.x;
  local_10[0x27].y = local_280.y;
  local_10[0x27].z = local_280.z;
  local_10[0x27].w = local_280.w;
  ImVec4::ImVec4(&local_290,0.469,0.469,0.469,1.0);
  local_10[0x28].x = local_290.x;
  local_10[0x28].y = local_290.y;
  local_10[0x28].z = local_290.z;
  local_10[0x28].w = local_290.w;
  ImVec4::ImVec4(&local_2a0,1.0,0.391,0.0,1.0);
  local_10[0x29].x = local_2a0.x;
  local_10[0x29].y = local_2a0.y;
  local_10[0x29].z = local_2a0.z;
  local_10[0x29].w = local_2a0.w;
  ImVec4::ImVec4(&local_2b0,0.586,0.586,0.586,1.0);
  local_10[0x2a].x = local_2b0.x;
  local_10[0x2a].y = local_2b0.y;
  local_10[0x2a].z = local_2b0.z;
  local_10[0x2a].w = local_2b0.w;
  ImVec4::ImVec4(&local_2c0,1.0,0.391,0.0,1.0);
  local_10[0x2b].x = local_2c0.x;
  local_10[0x2b].y = local_2c0.y;
  local_10[0x2b].z = local_2c0.z;
  local_10[0x2b].w = local_2c0.w;
  ImVec4::ImVec4(&local_2d0,1.0,1.0,1.0,0.156);
  local_10[0x31].x = local_2d0.x;
  local_10[0x31].y = local_2d0.y;
  local_10[0x31].z = local_2d0.z;
  local_10[0x31].w = local_2d0.w;
  ImVec4::ImVec4(&local_2e0,1.0,0.391,0.0,1.0);
  local_10[0x32].x = local_2e0.x;
  local_10[0x32].y = local_2e0.y;
  local_10[0x32].z = local_2e0.z;
  local_10[0x32].w = local_2e0.w;
  ImVec4::ImVec4(&local_2f0,1.0,0.391,0.0,1.0);
  local_10[0x33].x = local_2f0.x;
  local_10[0x33].y = local_2f0.y;
  local_10[0x33].z = local_2f0.z;
  local_10[0x33].w = local_2f0.w;
  ImVec4::ImVec4(&local_300,1.0,0.391,0.0,1.0);
  local_10[0x34].x = local_300.x;
  local_10[0x34].y = local_300.y;
  local_10[0x34].z = local_300.z;
  local_10[0x34].w = local_300.w;
  ImVec4::ImVec4(&local_310,0.0,0.0,0.0,0.586);
  local_10[0x35].x = local_310.x;
  local_10[0x35].y = local_310.y;
  local_10[0x35].z = local_310.z;
  local_10[0x35].w = local_310.w;
  ImVec4::ImVec4(&local_320,0.0,0.0,0.0,0.586);
  local_10[0x36].x = local_320.x;
  local_10[0x36].y = local_320.y;
  local_10[0x36].z = local_320.z;
  local_10[0x36].w = local_320.w;
  return;
}

Assistant:

void StyleColorsMahiDark2() {
    ImVec4 *colors                         = ImGui::GetStyle().Colors;
    colors[ImGuiCol_Text]                  = ImVec4(1.000f, 1.000f, 1.000f, 1.000f);
    colors[ImGuiCol_TextDisabled]          = ImVec4(0.500f, 0.500f, 0.500f, 1.000f);
    colors[ImGuiCol_WindowBg]              = ImVec4(0.180f, 0.180f, 0.180f, 1.000f);
    colors[ImGuiCol_ChildBg]               = ImVec4(0.280f, 0.280f, 0.280f, 0.000f);
    colors[ImGuiCol_PopupBg]               = ImVec4(0.313f, 0.313f, 0.313f, 1.000f);
    colors[ImGuiCol_Border]                = ImVec4(0.266f, 0.266f, 0.266f, 1.000f);
    colors[ImGuiCol_BorderShadow]          = ImVec4(0.000f, 0.000f, 0.000f, 0.000f);
    colors[ImGuiCol_FrameBg]               = ImVec4(0.160f, 0.160f, 0.160f, 1.000f);
    colors[ImGuiCol_FrameBgHovered]        = ImVec4(0.200f, 0.200f, 0.200f, 1.000f);
    colors[ImGuiCol_FrameBgActive]         = ImVec4(0.280f, 0.280f, 0.280f, 1.000f);
    colors[ImGuiCol_TitleBg]               = ImVec4(0.148f, 0.148f, 0.148f, 1.000f);
    colors[ImGuiCol_TitleBgActive]         = ImVec4(0.148f, 0.148f, 0.148f, 1.000f);
    colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(0.148f, 0.148f, 0.148f, 1.000f);
    colors[ImGuiCol_MenuBarBg]             = ImVec4(0.195f, 0.195f, 0.195f, 1.000f);
    colors[ImGuiCol_ScrollbarBg]           = ImVec4(0.160f, 0.160f, 0.160f, 1.000f);
    colors[ImGuiCol_ScrollbarGrab]         = ImVec4(0.277f, 0.277f, 0.277f, 1.000f);
    colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(0.300f, 0.300f, 0.300f, 1.000f);
    colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_CheckMark]             = ImVec4(1.000f, 1.000f, 1.000f, 1.000f);
    colors[ImGuiCol_SliderGrab]            = ImVec4(0.391f, 0.391f, 0.391f, 1.000f);
    colors[ImGuiCol_SliderGrabActive]      = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_Button]                = ImVec4(1.000f, 1.000f, 1.000f, 0.000f);
    colors[ImGuiCol_ButtonHovered]         = ImVec4(1.000f, 1.000f, 1.000f, 0.156f);
    colors[ImGuiCol_ButtonActive]          = ImVec4(1.000f, 1.000f, 1.000f, 0.391f);
    colors[ImGuiCol_Header]                = ImVec4(0.313f, 0.313f, 0.313f, 1.000f);
    colors[ImGuiCol_HeaderHovered]         = ImVec4(0.469f, 0.469f, 0.469f, 1.000f);
    colors[ImGuiCol_HeaderActive]          = ImVec4(0.469f, 0.469f, 0.469f, 1.000f);
    colors[ImGuiCol_Separator]             = colors[ImGuiCol_Border];
    colors[ImGuiCol_SeparatorHovered]      = ImVec4(0.391f, 0.391f, 0.391f, 1.000f);
    colors[ImGuiCol_SeparatorActive]       = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_ResizeGrip]            = ImVec4(1.000f, 1.000f, 1.000f, 0.250f);
    colors[ImGuiCol_ResizeGripHovered]     = ImVec4(1.000f, 1.000f, 1.000f, 0.670f);
    colors[ImGuiCol_ResizeGripActive]      = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_Tab]                   = ImVec4(0.098f, 0.098f, 0.098f, 1.000f);
    colors[ImGuiCol_TabHovered]            = ImVec4(0.352f, 0.352f, 0.352f, 1.000f);
    colors[ImGuiCol_TabActive]             = ImVec4(0.195f, 0.195f, 0.195f, 1.000f);
    colors[ImGuiCol_TabUnfocused]          = ImVec4(0.098f, 0.098f, 0.098f, 1.000f);
    colors[ImGuiCol_TabUnfocusedActive]    = ImVec4(0.195f, 0.195f, 0.195f, 1.000f);
    colors[ImGuiCol_DockingPreview]        = ImVec4(1.000f, 0.391f, 0.000f, 0.781f);
    colors[ImGuiCol_DockingEmptyBg]        = ImVec4(0.180f, 0.180f, 0.180f, 1.000f);
    colors[ImGuiCol_PlotLines]             = ImVec4(0.469f, 0.469f, 0.469f, 1.000f);
    colors[ImGuiCol_PlotLinesHovered]      = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_PlotHistogram]         = ImVec4(0.586f, 0.586f, 0.586f, 1.000f);
    colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_TextSelectedBg]        = ImVec4(1.000f, 1.000f, 1.000f, 0.156f);
    colors[ImGuiCol_DragDropTarget]        = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_NavHighlight]          = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_NavWindowingHighlight] = ImVec4(1.000f, 0.391f, 0.000f, 1.000f);
    colors[ImGuiCol_NavWindowingDimBg]     = ImVec4(0.000f, 0.000f, 0.000f, 0.586f);
    colors[ImGuiCol_ModalWindowDimBg]      = ImVec4(0.000f, 0.000f, 0.000f, 0.586f);
}